

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::encode_url(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  byte *pbVar4;
  char local_3d;
  int len;
  char hex [4];
  long lStack_38;
  uint8_t c;
  size_t i;
  string *s_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lStack_38 = 0;
  do {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar2 == '\0') {
      return __return_storage_ptr__;
    }
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)s);
    switch(*puVar3) {
    case 10:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%0A");
      break;
    default:
      pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)s);
      len._3_1_ = *pbVar4;
      if (len._3_1_ < 0x80) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'%');
        iVar1 = snprintf(&local_3d,3,"%02X",(ulong)len._3_1_);
        if (iVar1 != 2) {
          __assert_fail("len == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                        ,0x807,"std::string httplib::detail::encode_url(const std::string &)");
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_3d);
      }
      break;
    case 0xd:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%0D");
      break;
    case 0x20:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%20");
      break;
    case 0x27:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%27");
      break;
    case 0x2b:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%2B");
      break;
    case 0x2c:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%2C");
      break;
    case 0x3b:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%3B");
    }
    lStack_38 = lStack_38 + 1;
  } while( true );
}

Assistant:

inline std::string encode_url(const std::string &s) {
  std::string result;
  result.reserve(s.size());

  for (size_t i = 0; s[i]; i++) {
    switch (s[i]) {
    case ' ': result += "%20"; break;
    case '+': result += "%2B"; break;
    case '\r': result += "%0D"; break;
    case '\n': result += "%0A"; break;
    case '\'': result += "%27"; break;
    case ',': result += "%2C"; break;
    // case ':': result += "%3A"; break; // ok? probably...
    case ';': result += "%3B"; break;
    default:
      auto c = static_cast<uint8_t>(s[i]);
      if (c >= 0x80) {
        result += '%';
        char hex[4];
        auto len = snprintf(hex, sizeof(hex) - 1, "%02X", c);
        assert(len == 2);
        result.append(hex, static_cast<size_t>(len));
      } else {
        result += s[i];
      }
      break;
    }
  }

  return result;
}